

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O1

float __thiscall
deqp::gles3::Functional::Vertex3DTextureCase::calculateLod
          (Vertex3DTextureCase *this,Mat3 *transf,Vec2 *dstSize,int textureNdx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Texture3D *pTVar4;
  int row;
  long lVar5;
  Vector<float,_3> *pVVar6;
  int col_2;
  Vector<float,_3> *pVVar7;
  int col;
  long lVar8;
  uint uVar9;
  float v;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Vec3 trans10;
  Vec3 trans01;
  Vec3 trans00;
  float local_38 [4];
  float local_28 [4];
  float local_18 [6];
  
  pTVar4 = this->m_textures[textureNdx];
  iVar1 = (pTVar4->m_refTexture).m_width;
  iVar2 = (pTVar4->m_refTexture).m_height;
  iVar3 = (pTVar4->m_refTexture).m_depth;
  lVar5 = 0;
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 1.0;
  local_18[0] = 0.0;
  local_18[1] = 0.0;
  local_18[2] = 0.0;
  pVVar6 = (Vector<float,_3> *)transf;
  do {
    fVar10 = 0.0;
    lVar8 = 0;
    pVVar7 = pVVar6;
    do {
      fVar10 = fVar10 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar7->m_data)->m_data[0].m_data[0] *
                        local_28[lVar8];
      lVar8 = lVar8 + 1;
      pVVar7 = pVVar7 + 1;
    } while (lVar8 != 3);
    local_18[lVar5] = fVar10;
    lVar5 = lVar5 + 1;
    pVVar6 = (Vector<float,_3> *)(pVVar6->m_data + 1);
  } while (lVar5 != 3);
  local_38[0] = 0.0;
  local_38[1] = 1.0;
  local_38[2] = 1.0;
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  lVar5 = 0;
  pVVar6 = (Vector<float,_3> *)transf;
  do {
    fVar10 = 0.0;
    lVar8 = 0;
    pVVar7 = pVVar6;
    do {
      fVar10 = fVar10 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar7->m_data)->m_data[0].m_data[0] *
                        local_38[lVar8];
      lVar8 = lVar8 + 1;
      pVVar7 = pVVar7 + 1;
    } while (lVar8 != 3);
    local_28[lVar5] = fVar10;
    lVar5 = lVar5 + 1;
    pVVar6 = (Vector<float,_3> *)(pVVar6->m_data + 1);
  } while (lVar5 != 3);
  local_18[3] = 1.0;
  local_18[4] = 0.0;
  local_18[5] = 1.0;
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  lVar5 = 0;
  do {
    fVar10 = 0.0;
    lVar8 = 0;
    pVVar6 = (Vector<float,_3> *)transf;
    do {
      fVar10 = fVar10 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar6->m_data)->m_data[0].m_data[0] *
                        local_18[lVar8 + 3];
      lVar8 = lVar8 + 1;
      pVVar6 = pVVar6 + 1;
    } while (lVar8 != 3);
    local_38[lVar5] = fVar10;
    lVar5 = lVar5 + 1;
    transf = (Mat3 *)(((Vector<float,_3> *)transf)->m_data + 1);
  } while (lVar5 != 3);
  fVar15 = (float)iVar1;
  fVar10 = dstSize->m_data[0];
  fVar14 = dstSize->m_data[1];
  fVar11 = ((local_38[0] - local_18[0]) * fVar15) / fVar10;
  fVar15 = ((local_28[0] - local_18[0]) * fVar15) / fVar14;
  fVar13 = (float)iVar2;
  fVar12 = ((local_38[1] - local_18[1]) * fVar13) / fVar10;
  fVar13 = ((local_28[1] - local_18[1]) * fVar13) / fVar14;
  fVar16 = (float)iVar3;
  fVar10 = ((local_38[2] - local_18[2]) * fVar16) / fVar10;
  fVar14 = ((local_28[2] - local_18[2]) * fVar16) / fVar14;
  fVar10 = fVar10 * fVar10 + fVar11 * fVar11 + fVar12 * fVar12;
  fVar14 = fVar14 * fVar14 + fVar15 * fVar15 + fVar13 * fVar13;
  uVar9 = -(uint)(fVar14 <= fVar10);
  fVar10 = (float)(~uVar9 & (uint)fVar14 | (uint)fVar10 & uVar9);
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  fVar10 = logf(fVar10);
  return fVar10 * 1.442695;
}

Assistant:

float Vertex3DTextureCase::calculateLod (const Mat3& transf, const Vec2& dstSize, int textureNdx) const
{
	const tcu::Texture3D&	refTexture	= m_textures[textureNdx]->getRefTexture();
	const int				srcWidth	= refTexture.getWidth();
	const int				srcHeight	= refTexture.getHeight();
	const int				srcDepth	= refTexture.getDepth();

	// Calculate transformed coordinates of three screen corners.
	const Vec3				trans00		= transf * Vec3(0.0f, 0.0f, 1.0f);
	const Vec3				trans01		= transf * Vec3(0.0f, 1.0f, 1.0f);
	const Vec3				trans10		= transf * Vec3(1.0f, 0.0f, 1.0f);

	// Derivates.
	const float dudx = (trans10.x() - trans00.x()) * (float)srcWidth / dstSize.x();
	const float dudy = (trans01.x() - trans00.x()) * (float)srcWidth / dstSize.y();
	const float dvdx = (trans10.y() - trans00.y()) * (float)srcHeight / dstSize.x();
	const float dvdy = (trans01.y() - trans00.y()) * (float)srcHeight / dstSize.y();
	const float dwdx = (trans10.z() - trans00.z()) * (float)srcDepth / dstSize.x();
	const float dwdy = (trans01.z() - trans00.z()) * (float)srcDepth / dstSize.y();

	return deFloatLog2(deFloatSqrt(de::max(dudx*dudx + dvdx*dvdx + dwdx*dwdx, dudy*dudy + dvdy*dvdy + dwdy*dwdy)));
}